

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

char * nextArgument(char *start,char **str,size_t *len)

{
  long lVar1;
  char *pcVar2;
  
  if ((*start != '$') && (start = strchr(start,0x24), start == (char *)0x0)) {
    return (char *)0x0;
  }
  lVar1 = strtol(start + 1,(char **)0x0,10);
  *len = (long)(int)lVar1;
  pcVar2 = strchr(start,0xd);
  if (pcVar2 != (char *)0x0) {
    *str = pcVar2 + 2;
    return pcVar2 + (long)(int)lVar1 + 4;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/async.c"
                ,0x284,"const char *nextArgument(const char *, const char **, size_t *)");
}

Assistant:

static const char *nextArgument(const char *start, const char **str, size_t *len) {
    const char *p = start;
    if (p[0] != '$') {
        p = strchr(p,'$');
        if (p == NULL) return NULL;
    }

    *len = (int)strtol(p+1,NULL,10);
    p = strchr(p,'\r');
    assert(p);
    *str = p+2;
    return p+2+(*len)+2;
}